

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * format_abi_cxx11_(string *__return_storage_ptr__,char value)

{
  stringstream local_1a0 [8];
  stringstream s;
  ostream local_190 [383];
  char local_11;
  string *psStack_10;
  char value_local;
  
  local_11 = value;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,local_11);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (char value)
{
  std::stringstream s;
  s << value;
  return s.str ();
}